

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void write_tables_only(j_compress_ptr cinfo)

{
  int local_14;
  int i;
  j_compress_ptr cinfo_local;
  
  emit_marker(cinfo,M_SOI);
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    if (cinfo->quant_tbl_ptrs[local_14] != (JQUANT_TBL *)0x0) {
      emit_dqt(cinfo,local_14);
    }
  }
  if (cinfo->arith_code == 0) {
    for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
      if (cinfo->dc_huff_tbl_ptrs[local_14] != (JHUFF_TBL *)0x0) {
        emit_dht(cinfo,local_14,0);
      }
      if (cinfo->ac_huff_tbl_ptrs[local_14] != (JHUFF_TBL *)0x0) {
        emit_dht(cinfo,local_14,1);
      }
    }
  }
  emit_marker(cinfo,M_EOI);
  return;
}

Assistant:

METHODDEF(void)
write_tables_only (j_compress_ptr cinfo)
{
  int i;

  emit_marker(cinfo, M_SOI);

  for (i = 0; i < NUM_QUANT_TBLS; i++) {
    if (cinfo->quant_tbl_ptrs[i] != NULL)
      (void) emit_dqt(cinfo, i);
  }

  if (! cinfo->arith_code) {
    for (i = 0; i < NUM_HUFF_TBLS; i++) {
      if (cinfo->dc_huff_tbl_ptrs[i] != NULL)
	emit_dht(cinfo, i, FALSE);
      if (cinfo->ac_huff_tbl_ptrs[i] != NULL)
	emit_dht(cinfo, i, TRUE);
    }
  }

  emit_marker(cinfo, M_EOI);
}